

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::destroy_attribute(xml_attribute_struct *a,xml_allocator *alloc)

{
  xml_allocator *alloc_local;
  xml_attribute_struct *a_local;
  
  if ((a->header & 0x20) != 0) {
    xml_allocator::deallocate_string(alloc,a->name);
  }
  if ((a->header & 0x10) != 0) {
    xml_allocator::deallocate_string(alloc,a->value);
  }
  xml_allocator::deallocate_memory(alloc,a,0x28,(xml_memory_page *)((long)a - (a->header >> 8)));
  return;
}

Assistant:

inline void destroy_attribute(xml_attribute_struct* a, xml_allocator& alloc)
	{
		if (a->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(a->name);

		if (a->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(a->value);

		alloc.deallocate_memory(a, sizeof(xml_attribute_struct), PUGI__GETPAGE(a));
	}